

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

float predict_and_gradient(vw *all,example *ec)

{
  vw *all_00;
  long in_RSI;
  undefined8 *in_RDI;
  float fVar1;
  float fVar2;
  float loss_grad;
  label_data *ld;
  float fp;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  vw *in_stack_ffffffffffffffe0;
  
  fVar1 = bfgs_predict(in_stack_ffffffffffffffe0,
                       (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  all_00 = (vw *)(in_RSI + 0x6828);
  (*(code *)in_RDI[8])(*(undefined4 *)&all_00->sd,*in_RDI);
  fVar2 = (float)(**(code **)(*(long *)in_RDI[0x6a9] + 0x30))
                           (fVar1,*(undefined4 *)&all_00->sd,(long *)in_RDI[0x6a9],*in_RDI);
  GD::foreach_feature<float,_&add_grad>
            (all_00,(example *)
                    CONCAT44(fVar2 * *(float *)(in_RSI + 0x6870),in_stack_ffffffffffffffd8),
             (float *)0x287faf);
  return fVar1;
}

Assistant:

float predict_and_gradient(vw& all, example& ec)
{
  float fp = bfgs_predict(all, ec);
  label_data& ld = ec.l.simple;
  all.set_minmax(all.sd, ld.label);

  float loss_grad = all.loss->first_derivative(all.sd, fp, ld.label) * ec.weight;
  GD::foreach_feature<float, add_grad>(all, ec, loss_grad);

  return fp;
}